

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Expr * exprDup(sqlite3 *db,Expr *p,int dupFlags,u8 **pzBuffer)

{
  uint uVar1;
  sqlite3 *db_00;
  u8 **ppuVar2;
  uint uVar3;
  int iVar4;
  Expr *pOwner;
  Select *pSVar5;
  Expr *pEVar6;
  Window *pWVar7;
  size_t __n;
  uint uVar8;
  uint uVar9;
  u8 *local_50;
  uint local_44;
  sqlite3 *local_40;
  u8 **local_38;
  
  if (pzBuffer == (u8 **)0x0) {
    iVar4 = dupedExprSize(p,dupFlags);
    pOwner = (Expr *)sqlite3DbMallocRawNN(db,(long)iVar4);
    local_44 = 0;
  }
  else {
    pOwner = (Expr *)*pzBuffer;
    local_44 = 0x8000;
  }
  if (pOwner == (Expr *)0x0) {
    return (Expr *)0x0;
  }
  local_40 = db;
  local_38 = pzBuffer;
  uVar3 = dupedExprStructSize(p,dupFlags);
  uVar8 = p->flags;
  uVar9 = 0;
  if (((uVar8 >> 10 & 1) == 0) && (uVar9 = 0, (p->u).zToken != (char *)0x0)) {
    iVar4 = sqlite3Strlen30((p->u).zToken);
    uVar9 = iVar4 + 1;
  }
  if (dupFlags == 0) {
    uVar1 = 0x2c;
    if ((uVar8 >> 0xd & 1) == 0) {
      uVar1 = 0x50;
    }
    __n = 0x10;
    if ((uVar8 >> 0xe & 1) == 0) {
      __n = (size_t)uVar1;
    }
    memcpy(pOwner,p,__n);
    if ((uint)__n < 0x50) {
      memset(&pOwner->op + __n,0,0x50 - __n);
    }
  }
  else {
    memcpy(pOwner,p,(ulong)(uVar3 & 0xfff));
  }
  uVar8 = uVar3 & 0x6000 | local_44 | pOwner->flags & 0xfffe1fff;
  pOwner->flags = uVar8;
  if (uVar9 != 0) {
    (pOwner->u).zToken = (char *)(&pOwner->op + (uVar3 & 0xfff));
    memcpy(&pOwner->op + (uVar3 & 0xfff),(p->u).zToken,(ulong)uVar9);
    uVar8 = pOwner->flags;
  }
  ppuVar2 = local_38;
  db_00 = local_40;
  if (((uVar8 | p->flags) & 0x804000) == 0) {
    if ((p->flags >> 0xb & 1) == 0) {
      pSVar5 = (Select *)sqlite3ExprListDup(local_40,(p->x).pList,dupFlags);
    }
    else {
      pSVar5 = sqlite3SelectDup(local_40,(Select *)(p->x).pList,dupFlags);
    }
    (pOwner->x).pList = (ExprList *)pSVar5;
  }
  iVar4 = dupedExprNodeSize(p,dupFlags);
  local_50 = &pOwner->op + iVar4;
  if ((pOwner->flags & 0x6000) == 0) {
    uVar8 = p->flags;
    if ((uVar8 & 0x6000) == 0) {
      pWVar7 = sqlite3WindowDup(db_00,pOwner,p->pWin);
      uVar8 = p->flags;
    }
    else {
      pWVar7 = (Window *)0x0;
    }
    pOwner->pWin = pWVar7;
    if ((uVar8 & 0x804000) != 0) goto LAB_00170722;
    pEVar6 = p->pLeft;
    if (pOwner->op != 0xa6) {
      pEVar6 = sqlite3ExprDup(db_00,pEVar6,0);
    }
    pOwner->pLeft = pEVar6;
    pEVar6 = sqlite3ExprDup(db_00,p->pRight,0);
  }
  else {
    if ((pOwner->flags & 0x804000) != 0) goto LAB_00170722;
    if (p->pLeft == (Expr *)0x0) {
      pEVar6 = (Expr *)0x0;
    }
    else {
      pEVar6 = exprDup(db_00,p->pLeft,1,&local_50);
    }
    pOwner->pLeft = pEVar6;
    if (p->pRight == (Expr *)0x0) {
      pEVar6 = (Expr *)0x0;
    }
    else {
      pEVar6 = exprDup(db_00,p->pRight,1,&local_50);
    }
  }
  pOwner->pRight = pEVar6;
LAB_00170722:
  if (ppuVar2 != (u8 **)0x0) {
    *ppuVar2 = local_50;
  }
  return pOwner;
}

Assistant:

static Expr *exprDup(sqlite3 *db, Expr *p, int dupFlags, u8 **pzBuffer){
  Expr *pNew;           /* Value to return */
  u8 *zAlloc;           /* Memory space from which to build Expr object */
  u32 staticFlag;       /* EP_Static if space not obtained from malloc */

  assert( db!=0 );
  assert( p );
  assert( dupFlags==0 || dupFlags==EXPRDUP_REDUCE );
  assert( pzBuffer==0 || dupFlags==EXPRDUP_REDUCE );

  /* Figure out where to write the new Expr structure. */
  if( pzBuffer ){
    zAlloc = *pzBuffer;
    staticFlag = EP_Static;
  }else{
    zAlloc = sqlite3DbMallocRawNN(db, dupedExprSize(p, dupFlags));
    staticFlag = 0;
  }
  pNew = (Expr *)zAlloc;

  if( pNew ){
    /* Set nNewSize to the size allocated for the structure pointed to
    ** by pNew. This is either EXPR_FULLSIZE, EXPR_REDUCEDSIZE or
    ** EXPR_TOKENONLYSIZE. nToken is set to the number of bytes consumed
    ** by the copy of the p->u.zToken string (if any).
    */
    const unsigned nStructSize = dupedExprStructSize(p, dupFlags);
    const int nNewSize = nStructSize & 0xfff;
    int nToken;
    if( !ExprHasProperty(p, EP_IntValue) && p->u.zToken ){
      nToken = sqlite3Strlen30(p->u.zToken) + 1;
    }else{
      nToken = 0;
    }
    if( dupFlags ){
      assert( ExprHasProperty(p, EP_Reduced)==0 );
      memcpy(zAlloc, p, nNewSize);
    }else{
      u32 nSize = (u32)exprStructSize(p);
      memcpy(zAlloc, p, nSize);
      if( nSize<EXPR_FULLSIZE ){ 
        memset(&zAlloc[nSize], 0, EXPR_FULLSIZE-nSize);
      }
    }

    /* Set the EP_Reduced, EP_TokenOnly, and EP_Static flags appropriately. */
    pNew->flags &= ~(EP_Reduced|EP_TokenOnly|EP_Static|EP_MemToken);
    pNew->flags |= nStructSize & (EP_Reduced|EP_TokenOnly);
    pNew->flags |= staticFlag;

    /* Copy the p->u.zToken string, if any. */
    if( nToken ){
      char *zToken = pNew->u.zToken = (char*)&zAlloc[nNewSize];
      memcpy(zToken, p->u.zToken, nToken);
    }

    if( 0==((p->flags|pNew->flags) & (EP_TokenOnly|EP_Leaf)) ){
      /* Fill in the pNew->x.pSelect or pNew->x.pList member. */
      if( ExprHasProperty(p, EP_xIsSelect) ){
        pNew->x.pSelect = sqlite3SelectDup(db, p->x.pSelect, dupFlags);
      }else{
        pNew->x.pList = sqlite3ExprListDup(db, p->x.pList, dupFlags);
      }
    }

    /* Fill in pNew->pLeft and pNew->pRight. */
    zAlloc += dupedExprNodeSize(p, dupFlags);
    if( ExprHasProperty(pNew, EP_Reduced|EP_TokenOnly) ){
      if( !ExprHasProperty(pNew, EP_TokenOnly|EP_Leaf) ){
        pNew->pLeft = p->pLeft ?
                      exprDup(db, p->pLeft, EXPRDUP_REDUCE, &zAlloc) : 0;
        pNew->pRight = p->pRight ?
                       exprDup(db, p->pRight, EXPRDUP_REDUCE, &zAlloc) : 0;
      }
    }else{
#ifndef SQLITE_OMIT_WINDOWFUNC
      if( ExprHasProperty(p, EP_Reduced|EP_TokenOnly) ){
        pNew->pWin = 0;
      }else{
        pNew->pWin = sqlite3WindowDup(db, pNew, p->pWin);
      }
#endif /* SQLITE_OMIT_WINDOWFUNC */
      if( !ExprHasProperty(p, EP_TokenOnly|EP_Leaf) ){
        if( pNew->op==TK_SELECT_COLUMN ){
          pNew->pLeft = p->pLeft;
          assert( p->iColumn==0 || p->pRight==0 );
          assert( p->pRight==0  || p->pRight==p->pLeft );
        }else{
          pNew->pLeft = sqlite3ExprDup(db, p->pLeft, 0);
        }
        pNew->pRight = sqlite3ExprDup(db, p->pRight, 0);
      }
    }
    if( pzBuffer ){
      *pzBuffer = zAlloc;
    }
  }
  return pNew;
}